

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::linkInterfaces(CoreBroker *this,ActionMessage *command)

{
  string_view name;
  string_view name_00;
  string_view target_00;
  string_view target_01;
  string_view endpoint;
  string_view endpoint_00;
  string_view source;
  string_view source_00;
  string_view filter;
  string_view filter_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  bool bVar1;
  action_t aVar2;
  ActionMessage *cmd;
  ActionMessage *in_RSI;
  long in_RDI;
  HandleManager *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  undefined1 in_stack_00000078 [16];
  ActionMessage error;
  runtime_error *rtError;
  BasicHandleInfo *ept_1;
  BasicHandleInfo *filt;
  BasicHandleInfo *target;
  BasicHandleInfo *ept;
  BasicHandleInfo *input;
  BasicHandleInfo *pub;
  undefined8 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  ActionMessage *in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined7 uVar3;
  InterfaceType in_stack_fffffffffffffcff;
  undefined1 uVar4;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  GlobalFederateId dest;
  SmallBuffer *in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  GlobalFederateId local_1a4;
  __sv_type local_1a0;
  string_view local_180;
  GlobalHandle local_170;
  __sv_type local_168;
  string_view local_158;
  __sv_type local_148;
  string_view local_138;
  __sv_type local_128;
  BasicHandleInfo *local_118;
  GlobalHandle local_110;
  string_view local_108;
  BasicHandleInfo *local_f8;
  GlobalHandle local_f0;
  __sv_type local_e8;
  string_view local_d8;
  __sv_type local_c8;
  BasicHandleInfo *local_b8;
  GlobalHandle local_b0;
  __sv_type local_a8;
  string_view local_98;
  BasicHandleInfo *local_88;
  GlobalHandle local_80;
  __sv_type local_78;
  string_view local_68;
  __sv_type local_58;
  BasicHandleInfo *local_48;
  GlobalHandle local_40;
  __sv_type local_38;
  string_view local_28;
  BasicHandleInfo *local_18;
  ActionMessage *local_10;
  
  local_10 = in_RSI;
  aVar2 = ActionMessage::action(in_RSI);
  switch(aVar2) {
  case cmd_data_link:
    local_28 = ActionMessage::name((ActionMessage *)0x5ef3d7);
    name_01._M_str = in_stack_fffffffffffffd10;
    name_01._M_len = (size_t)in_stack_fffffffffffffd08;
    local_18 = HandleManager::getInterfaceHandle
                         ((HandleManager *)
                          CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),name_01,
                          in_stack_fffffffffffffcff);
    if (local_18 == (BasicHandleInfo *)0x0) {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
      local_58 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      name_02._M_str = in_stack_fffffffffffffd10;
      name_02._M_len = (size_t)in_stack_fffffffffffffd08;
      local_48 = HandleManager::getInterfaceHandle
                           ((HandleManager *)
                            CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),name_02,
                            in_stack_fffffffffffffcff);
      if (local_48 == (BasicHandleInfo *)0x0) {
        if ((*(byte *)(in_RDI + 0x29c) & 1) == 0) {
          routeMessage((CoreBroker *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       (ActionMessage *)
                       CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        }
        else {
          local_68 = ActionMessage::name((ActionMessage *)0x5ef573);
          ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
          local_78 = std::__cxx11::string::operator_cast_to_basic_string_view
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
          source._M_len._7_1_ = in_stack_fffffffffffffcff;
          source._M_len._0_7_ = in_stack_fffffffffffffcf8;
          source._M_str._0_4_ = in_stack_fffffffffffffd00;
          source._M_str._4_4_ = in_stack_fffffffffffffd04;
          target_00._M_str = in_stack_fffffffffffffcf0;
          target_00._M_len = (size_t)in_stack_fffffffffffffce8;
          UnknownHandleManager::addDataLink
                    ((UnknownHandleManager *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),source,target_00)
          ;
        }
      }
      else {
        ActionMessage::setAction(local_10,cmd_add_named_publication);
        local_80 = local_48->handle;
        ActionMessage::setSource(local_10,local_80);
        checkForNamedInterface
                  ((CoreBroker *)error.payload.bufferSize,
                   (ActionMessage *)error.payload.buffer._M_elems._56_8_);
      }
    }
    else {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
      local_38 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      name._M_str._0_4_ = in_stack_fffffffffffffce0;
      name._M_len = in_stack_fffffffffffffcd8;
      name._M_str._4_4_ = in_stack_fffffffffffffce4;
      ActionMessage::name((ActionMessage *)0x5ef474,name);
      ActionMessage::setAction(local_10,cmd_add_named_input);
      local_40 = local_18->handle;
      ActionMessage::setSource(local_10,local_40);
      checkForNamedInterface
                ((CoreBroker *)error.payload.bufferSize,
                 (ActionMessage *)error.payload.buffer._M_elems._56_8_);
    }
    break;
  default:
    break;
  case cmd_filter_link:
    local_108 = ActionMessage::name((ActionMessage *)0x5ef90e);
    name_05._M_str = in_stack_fffffffffffffd10;
    name_05._M_len = (size_t)in_stack_fffffffffffffd08;
    local_f8 = HandleManager::getInterfaceHandle
                         ((HandleManager *)
                          CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),name_05,
                          in_stack_fffffffffffffcff);
    if (local_f8 == (BasicHandleInfo *)0x0) {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
      local_128 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      name_06._M_str = in_stack_fffffffffffffd10;
      name_06._M_len = (size_t)in_stack_fffffffffffffd08;
      local_118 = HandleManager::getInterfaceHandle
                            ((HandleManager *)
                             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),name_06,
                             in_stack_fffffffffffffcff);
      if (local_118 == (BasicHandleInfo *)0x0) {
        if ((*(byte *)(in_RDI + 0x29c) & 1) == 0) {
          routeMessage((CoreBroker *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       (ActionMessage *)
                       CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        }
        else {
          bVar1 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                            (local_10,destination_target);
          if (bVar1) {
            local_138 = ActionMessage::name((ActionMessage *)0x5efab5);
            ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4)
            ;
            local_148 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
            ;
            filter._M_len._7_1_ = in_stack_fffffffffffffcff;
            filter._M_len._0_7_ = in_stack_fffffffffffffcf8;
            filter._M_str._0_4_ = in_stack_fffffffffffffd00;
            filter._M_str._4_4_ = in_stack_fffffffffffffd04;
            endpoint._M_str = in_stack_fffffffffffffcf0;
            endpoint._M_len = (size_t)in_stack_fffffffffffffce8;
            UnknownHandleManager::addDestinationFilterLink
                      ((UnknownHandleManager *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),filter,endpoint
                      );
          }
          else {
            local_158 = ActionMessage::name((ActionMessage *)0x5efb3b);
            ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4)
            ;
            local_168 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
            ;
            filter_00._M_len._7_1_ = in_stack_fffffffffffffcff;
            filter_00._M_len._0_7_ = in_stack_fffffffffffffcf8;
            filter_00._M_str._0_4_ = in_stack_fffffffffffffd00;
            filter_00._M_str._4_4_ = in_stack_fffffffffffffd04;
            endpoint_00._M_str = in_stack_fffffffffffffcf0;
            endpoint_00._M_len = (size_t)in_stack_fffffffffffffce8;
            UnknownHandleManager::addSourceFilterLink
                      ((UnknownHandleManager *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),filter_00,
                       endpoint_00);
          }
        }
      }
      else {
        ActionMessage::setAction(local_10,cmd_add_named_filter);
        local_170 = local_118->handle;
        ActionMessage::setSource(local_10,local_170);
        checkForNamedInterface
                  ((CoreBroker *)error.payload.bufferSize,
                   (ActionMessage *)error.payload.buffer._M_elems._56_8_);
      }
    }
    else {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
      SmallBuffer::operator=
                (in_stack_fffffffffffffd08,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      ActionMessage::setAction(local_10,cmd_add_named_endpoint);
      local_110 = local_f8->handle;
      ActionMessage::setSource(local_10,local_110);
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                        ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                          *)local_f8,clone_flag);
      if (bVar1) {
        setActionFlag<helics::ActionMessage,helics::FilterFlags>(local_10,clone_flag);
      }
      checkForNamedInterface
                ((CoreBroker *)error.payload.bufferSize,
                 (ActionMessage *)error.payload.buffer._M_elems._56_8_);
    }
    break;
  case cmd_endpoint_link:
    local_98 = ActionMessage::name((ActionMessage *)0x5ef663);
    name_03._M_str = in_stack_fffffffffffffd10;
    name_03._M_len = (size_t)in_stack_fffffffffffffd08;
    local_88 = HandleManager::getInterfaceHandle
                         ((HandleManager *)
                          CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),name_03,
                          in_stack_fffffffffffffcff);
    if (local_88 == (BasicHandleInfo *)0x0) {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
      local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      name_04._M_str = in_stack_fffffffffffffd10;
      name_04._M_len = (size_t)in_stack_fffffffffffffd08;
      local_b8 = HandleManager::getInterfaceHandle
                           ((HandleManager *)
                            CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),name_04,
                            in_stack_fffffffffffffcff);
      if (local_b8 == (BasicHandleInfo *)0x0) {
        if ((*(byte *)(in_RDI + 0x29c) & 1) == 0) {
          routeMessage((CoreBroker *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       (ActionMessage *)
                       CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        }
        else {
          local_d8 = ActionMessage::name((ActionMessage *)0x5ef810);
          ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
          local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
          source_00._M_len._7_1_ = in_stack_fffffffffffffcff;
          source_00._M_len._0_7_ = in_stack_fffffffffffffcf8;
          source_00._M_str._0_4_ = in_stack_fffffffffffffd00;
          source_00._M_str._4_4_ = in_stack_fffffffffffffd04;
          target_01._M_str = in_stack_fffffffffffffcf0;
          target_01._M_len = (size_t)in_stack_fffffffffffffce8;
          UnknownHandleManager::addEndpointLink
                    ((UnknownHandleManager *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),source_00,
                     target_01);
        }
      }
      else {
        ActionMessage::setAction(local_10,cmd_add_named_endpoint);
        local_f0 = local_b8->handle;
        ActionMessage::setSource(local_10,local_f0);
        local_10->counter = 0x65;
        checkForNamedInterface
                  ((CoreBroker *)error.payload.bufferSize,
                   (ActionMessage *)error.payload.buffer._M_elems._56_8_);
      }
    }
    else {
      ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
      local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      name_00._M_str._0_4_ = in_stack_fffffffffffffce0;
      name_00._M_len = in_stack_fffffffffffffcd8;
      name_00._M_str._4_4_ = in_stack_fffffffffffffce4;
      ActionMessage::name((ActionMessage *)0x5ef6f7,name_00);
      ActionMessage::setAction(local_10,cmd_add_named_endpoint);
      setActionFlag<helics::ActionMessage,helics::InterfaceFlags>(local_10,destination_target);
      local_10->counter = 0x65;
      local_b0 = local_88->handle;
      ActionMessage::setSource(local_10,local_b0);
      checkForNamedInterface
                ((CoreBroker *)error.payload.bufferSize,
                 (ActionMessage *)error.payload.buffer._M_elems._56_8_);
    }
    break;
  case cmd_add_alias:
    uVar3 = (undefined7)(in_RDI + 0x438);
    uVar4 = (undefined1)((ulong)(in_RDI + 0x438) >> 0x38);
    local_180 = SmallBuffer::to_string((SmallBuffer *)0x5efc2f);
    dest.gid = local_180._M_str._4_4_;
    cmd = (ActionMessage *)
          ActionMessage::getString_abi_cxx11_(in_stack_fffffffffffffce8,in_stack_fffffffffffffce4);
    local_1a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    HandleManager::addAlias
              (in_stack_00000060,(string_view)in_stack_00000078,(string_view)in_stack_00000068);
    if ((*(byte *)(in_RDI + 0x29c) & 1) == 0) {
      GlobalFederateId::GlobalFederateId(&local_1a4,(GlobalBrokerId)0x0);
      routeMessage((CoreBroker *)CONCAT17(uVar4,uVar3),cmd,dest);
    }
  }
  return;
}

Assistant:

void CoreBroker::linkInterfaces(ActionMessage& command)
{
    switch (command.action()) {
        case CMD_DATA_LINK: {
            auto* pub = handles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                command.name(command.getString(targetStringLoc));
                command.setAction(CMD_ADD_NAMED_INPUT);
                command.setSource(pub->handle);
                checkForNamedInterface(command);
            } else {
                auto* input = handles.getInterfaceHandle(command.getString(targetStringLoc),
                                                         InterfaceType::INPUT);
                if (input == nullptr) {
                    if (isRootc) {
                        unknownHandles.addDataLink(command.name(),
                                                   command.getString(targetStringLoc));
                    } else {
                        routeMessage(command);
                    }
                } else {
                    command.setAction(CMD_ADD_NAMED_PUBLICATION);
                    command.setSource(input->handle);
                    checkForNamedInterface(command);
                }
            }
        } break;
        case CMD_ENDPOINT_LINK: {
            auto* ept = handles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                command.name(command.getString(targetStringLoc));
                command.setAction(CMD_ADD_NAMED_ENDPOINT);
                setActionFlag(command, destination_target);
                command.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                command.setSource(ept->handle);
                checkForNamedInterface(command);
            } else {
                auto* target = handles.getInterfaceHandle(command.getString(targetStringLoc),
                                                          InterfaceType::ENDPOINT);
                if (target == nullptr) {
                    if (isRootc) {
                        unknownHandles.addEndpointLink(command.name(),
                                                       command.getString(targetStringLoc));
                    } else {
                        routeMessage(command);
                    }
                } else {
                    command.setAction(CMD_ADD_NAMED_ENDPOINT);
                    command.setSource(target->handle);
                    command.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                    checkForNamedInterface(command);
                }
            }
        } break;
        case CMD_FILTER_LINK: {
            auto* filt = handles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.payload = command.getString(targetStringLoc);
                command.setAction(CMD_ADD_NAMED_ENDPOINT);
                command.setSource(filt->handle);
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(command, clone_flag);
                }
                checkForNamedInterface(command);
            } else {
                auto* ept = handles.getInterfaceHandle(command.getString(targetStringLoc),
                                                       InterfaceType::ENDPOINT);
                if (ept == nullptr) {
                    if (isRootc) {
                        if (checkActionFlag(command, destination_target)) {
                            unknownHandles.addDestinationFilterLink(command.name(),
                                                                    command.getString(
                                                                        targetStringLoc));
                        } else {
                            unknownHandles.addSourceFilterLink(command.name(),
                                                               command.getString(targetStringLoc));
                        }
                    } else {
                        routeMessage(command);
                    }
                } else {
                    command.setAction(CMD_ADD_NAMED_FILTER);
                    command.setSource(ept->handle);
                    checkForNamedInterface(command);
                }
            }
        } break;
        case CMD_ADD_ALIAS:
            try {
                handles.addAlias(command.payload.to_string(), command.getString(targetStringLoc));
                if (!isRootc) {
                    routeMessage(std::move(command), parent_broker_id);
                }
            }
            catch (const std::runtime_error& rtError) {
                ActionMessage error(CMD_ERROR);
                error.setDestination(command.getSource());
                error.source_id = global_broker_id_local;
                error.payload = rtError.what();
                routeMessage(std::move(error));
            }
            break;
        default:
            break;
    }
}